

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_RsbPrint(Gia_RsbMan_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t **ppVVar7;
  long lVar8;
  bool bVar9;
  undefined8 uVar10;
  uint local_4c;
  Vec_Int_t *local_48 [2];
  Vec_Int_t *local_38;
  
  uVar1 = p->vObjs->nSize;
  iVar4 = 1 << ((byte)uVar1 & 0x1f);
  if (p->vSets[0]->nSize != iVar4) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x553,"void Gia_RsbPrint(Gia_RsbMan_t *)");
  }
  if (p->vSets[1]->nSize != iVar4) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x554,"void Gia_RsbPrint(Gia_RsbMan_t *)");
  }
  uVar5 = Gia_RsbCost(p);
  printf("Database for %d objects and cost %d:\n",(ulong)uVar1,(ulong)uVar5);
  local_4c = 0;
  pVVar6 = p->vSets[0];
  if (0 < pVVar6->nSize) {
    do {
      if ((int)local_4c < 0) {
LAB_007c6ca5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      local_48[0] = pVVar6->pArray + local_4c;
      if (p->vSets[1]->nSize <= (int)local_4c) goto LAB_007c6ca5;
      local_38 = p->vSets[1]->pArray + local_4c;
      uVar10 = 0;
      ppVVar7 = local_48;
      bVar3 = true;
      do {
        bVar9 = bVar3;
        printf("%5d : ",(ulong)local_4c);
        Extra_PrintBinary2(_stdout,&local_4c,p->vObjs->nSize);
        printf(" %d ",uVar10);
        pVVar2 = *ppVVar7;
        printf("Vector has %d entries: {",(ulong)(uint)pVVar2->nSize);
        if (0 < pVVar2->nSize) {
          lVar8 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar2->pArray[lVar8]);
            lVar8 = lVar8 + 1;
          } while (lVar8 < pVVar2->nSize);
        }
        puts(" }");
        uVar10 = 1;
        ppVVar7 = &local_38;
        bVar3 = false;
      } while (bVar9);
      local_4c = local_4c + 1;
      pVVar6 = p->vSets[0];
    } while ((int)local_4c < pVVar6->nSize);
  }
  return;
}

Assistant:

void Gia_RsbPrint( Gia_RsbMan_t * p )
{
    Vec_Int_t * vLevel[2]; 
    int n, i, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == nLeaves );
    printf( "Database for %d objects and cost %d:\n", Vec_IntSize(p->vObjs), Gia_RsbCost(p) );
    Vec_WecForEachLevelTwo( p->vSets[0], p->vSets[1], vLevel[0], vLevel[1], i )
    {
        for ( n = 0; n < 2; n++ )
        {
            printf( "%5d : ", i );
            Extra_PrintBinary2( stdout, (unsigned*)&i, Vec_IntSize(p->vObjs) ); printf( " %d ", n );
            Vec_IntPrint( vLevel[n] );
        }
    }    
}